

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O2

bool loadWireProgram(void)

{
  bool bVar1;
  GLenum GVar2;
  djg_program *program;
  char buf [1024];
  
  program = djgp_create();
  fwrite("Loading {Wire-Program}\n",0x17,1,_stdout);
  fflush(_stdout);
  djgp_push_string(program,"#define BUFFER_BINDING_TRANSFORMS %i\n",1);
  strcat2(buf,g_app.dir.shader,"wire.glsl");
  djgp_push_file(program,buf);
  bVar1 = djgp_to_gl(program,0x1c2,false,true,g_gl.programs + 3);
  if (bVar1) {
    djgp_release(program);
    g_gl.uniforms[0xe] = (*glad_glGetUniformLocation)(g_gl.programs[3],"u_InstanceCount");
    configureWireProgram();
    GVar2 = (*glad_glGetError)();
    bVar1 = GVar2 == 0;
  }
  else {
    fwrite("=> Failure <=\n",0xe,1,_stdout);
    fflush(_stdout);
    djgp_release(program);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool loadWireProgram()
{
    djg_program *djp = djgp_create();
    GLuint *program = &g_gl.programs[PROGRAM_WIRE];
    char buf[1024];

    LOG("Loading {Wire-Program}\n");
    djgp_push_string(djp, "#define BUFFER_BINDING_TRANSFORMS %i\n", STREAM_TRANSFORM);
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "wire.glsl"));

    if (!djgp_to_gl(djp, 450, false, true, program)) {
        LOG("=> Failure <=\n");
        djgp_release(djp);

        return false;
    }
    djgp_release(djp);

    g_gl.uniforms[UNIFORM_WIRE_INSTANCE_COUNT] =
        glGetUniformLocation(g_gl.programs[PROGRAM_WIRE], "u_InstanceCount");

    configureWireProgram();

    return (glGetError() == GL_NO_ERROR);
}